

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O3

Material * __thiscall Assimp::ASE::Material::operator=(Material *this,Material *other)

{
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> local_38;
  
  if (this != other) {
    D3DS::Material::operator=(&this->super_Material,&other->super_Material);
    local_38.super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->avSubMaterials).
         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->avSubMaterials).
         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_38.super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->avSubMaterials).
         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->avSubMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_start =
         (other->avSubMaterials).
         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->avSubMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (other->avSubMaterials).
         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->avSubMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (other->avSubMaterials).
         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (other->avSubMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (other->avSubMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (other->avSubMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector(&local_38);
    this->pcInstance = other->pcInstance;
    this->bNeed = other->bNeed;
    other->pcInstance = (aiMaterial *)0x0;
  }
  return this;
}

Assistant:

Material &operator=(Material &&other) AI_NO_EXCEPT {
        if (this == &other) {
            return *this;
        }

        D3DS::Material::operator=(std::move(other));

        avSubMaterials = std::move(other.avSubMaterials);
        pcInstance = std::move(other.pcInstance);
        bNeed = std::move(other.bNeed);

        other.pcInstance = nullptr;

        return *this;
    }